

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.capnp.h
# Opt level: O2

Builder * __thiscall
capnp::compiler::Token::Builder::initStringLiteral
          (Builder *__return_storage_ptr__,Builder *this,uint size)

{
  PointerBuilder local_28;
  
  *(undefined2 *)(this->_builder).data = 1;
  local_28.pointer = (this->_builder).pointers;
  local_28.segment = (this->_builder).segment;
  local_28.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::initBlob<capnp::Text>(__return_storage_ptr__,&local_28,size);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnp::Text::Builder Token::Builder::initStringLiteral(unsigned int size) {
  _builder.setDataField<Token::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Token::STRING_LITERAL);
  return ::capnp::_::PointerHelpers< ::capnp::Text>::init(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS), size);
}